

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayoutState::apply(QMainWindowLayoutState *this,bool animated)

{
  bool in_stack_0000006f;
  QToolBarAreaLayout *in_stack_00000070;
  
  QToolBarAreaLayout::apply(in_stack_00000070,in_stack_0000006f);
  QDockAreaLayout::apply((QDockAreaLayout *)this,animated);
  return;
}

Assistant:

void QMainWindowLayoutState::apply(bool animated)
{
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.apply(animated);
#endif

#if QT_CONFIG(dockwidget)
//    dumpLayout(dockAreaLayout, QString());
    dockAreaLayout.apply(animated);
#else
    if (centralWidgetItem) {
        QMainWindowLayout *layout = qt_mainwindow_layout(mainWindow);
        Q_ASSERT(layout);
        layout->widgetAnimator.animate(centralWidgetItem->widget(), centralWidgetRect, animated);
    }
#endif
}